

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::PlatformIs64Bit(cmMakefile *this)

{
  int iVar1;
  char *__nptr;
  bool bVar2;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"CMAKE_SIZEOF_VOID_P",&local_31);
  __nptr = GetDefinition(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (__nptr == (char *)0x0) {
    bVar2 = false;
  }
  else {
    iVar1 = atoi(__nptr);
    bVar2 = iVar1 == 8;
  }
  return bVar2;
}

Assistant:

bool cmMakefile::PlatformIs64Bit() const
{
  if(const char* sizeof_dptr = this->GetDefinition("CMAKE_SIZEOF_VOID_P"))
    {
    return atoi(sizeof_dptr) == 8;
    }
  return false;
}